

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O3

int32_t __thiscall icu_63::CollationRuleParser::skipComment(CollationRuleParser *this,int32_t i)

{
  short sVar1;
  char16_t cVar2;
  UnicodeString *pUVar3;
  long lVar4;
  uint uVar5;
  char16_t *pcVar6;
  
  pUVar3 = this->rules;
  sVar1 = (pUVar3->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar5 = (pUVar3->fUnion).fFields.fLength;
  }
  else {
    uVar5 = (int)sVar1 >> 5;
  }
  if ((int)uVar5 <= i) {
    return i;
  }
  lVar4 = (long)i;
  do {
    if ((uint)lVar4 < uVar5) {
      pcVar6 = (char16_t *)((long)&pUVar3->fUnion + 2);
      if (((int)sVar1 & 2U) == 0) {
        pcVar6 = (pUVar3->fUnion).fFields.fArray;
      }
      cVar2 = pcVar6[lVar4];
      if (((((ushort)cVar2 < 0xe) && ((0x3400U >> ((ushort)cVar2 & 0x1f) & 1) != 0)) ||
          ((ushort)cVar2 - 0x2028 < 2)) || (cVar2 == L'\x85')) {
        return (uint)lVar4 + 1;
      }
    }
    lVar4 = lVar4 + 1;
    if (uVar5 == (uint)lVar4) {
      return uVar5;
    }
  } while( true );
}

Assistant:

int32_t
CollationRuleParser::skipComment(int32_t i) const {
    // skip to past the newline
    while(i < rules->length()) {
        UChar c = rules->charAt(i++);
        // LF or FF or CR or NEL or LS or PS
        if(c == 0xa || c == 0xc || c == 0xd || c == 0x85 || c == 0x2028 || c == 0x2029) {
            // Unicode Newline Guidelines: "A readline function should stop at NLF, LS, FF, or PS."
            // NLF (new line function) = CR or LF or CR+LF or NEL.
            // No need to collect all of CR+LF because a following LF will be ignored anyway.
            break;
        }
    }
    return i;
}